

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm.c
# Opt level: O1

PGMData * binaryPGM(PGMData *data)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  float *pfVar4;
  long lVar5;
  ulong uVar6;
  
  iVar2 = data->row;
  if (0 < (long)iVar2) {
    uVar3 = data->col;
    lVar5 = 0;
    do {
      if (0 < (int)uVar3) {
        pfVar4 = data->pixel_matrix[lVar5];
        uVar6 = 0;
        do {
          fVar1 = pfVar4[uVar6];
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            pfVar4[uVar6] = 1.0;
          }
          uVar6 = uVar6 + 1;
        } while (uVar3 != uVar6);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != iVar2);
  }
  data->max_greyscale = 1;
  return data;
}

Assistant:

PGMData *binaryPGM(PGMData *data)
{
    for (int i = 0; i < data->row; i++)
    {
        for (int j = 0; j < data->col; j++)
        {
            if (data->pixel_matrix[i][j] != 0)
                data->pixel_matrix[i][j] = 1;
        }
    }

    data->max_greyscale = 1;

    return data;
}